

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
cs::method_for::preprocess
          (method_for *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  value_type ptVar1;
  token_base *ptVar2;
  int iVar3;
  const_reference pptVar4;
  token_base **pptVar5;
  internal_error *this_00;
  compile_error *pcVar6;
  ulong uVar7;
  _func_int **pp_Var8;
  long lVar9;
  ulong uVar10;
  string local_38;
  
  pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar4;
  local_38._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_38);
  if (*pptVar5 == (token_base *)0x0) {
    this_00 = (internal_error *)__cxa_allocate_exception(0x28);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Null pointer accessed.","")
    ;
    internal_error::internal_error(this_00,&local_38);
    __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_38._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_38);
  iVar3 = (*(*pptVar5)->_vptr_token_base[2])();
  if (iVar3 != 0xf) {
    pcVar6 = (compile_error *)__cxa_allocate_exception(0x28);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>",
               "");
    compile_error::compile_error(pcVar6,&local_38);
    __cxa_throw(pcVar6,&compile_error::typeinfo,compile_error::~compile_error);
  }
  local_38._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_38);
  ptVar2 = *pptVar5;
  pp_Var8 = ptVar2[2]._vptr_token_base;
  if (((long)ptVar2[3]._vptr_token_base - (long)pp_Var8 >> 3) +
      ((long)((long)ptVar2[4]._vptr_token_base - ptVar2[4].line_num) >> 3) +
      (((ptVar2[5].line_num - ptVar2[3].line_num >> 3) - 1) + (ulong)(ptVar2[5].line_num == 0)) *
      0x40 != 3) {
    pcVar6 = (compile_error *)__cxa_allocate_exception(0x28);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>",
               "");
    compile_error::compile_error(pcVar6,&local_38);
    __cxa_throw(pcVar6,&compile_error::typeinfo,compile_error::~compile_error);
  }
  lVar9 = (long)pp_Var8 - ptVar2[2].line_num;
  uVar7 = lVar9 >> 3;
  if ((long)uVar7 < 0) {
    uVar10 = lVar9 >> 9;
  }
  else {
    if (uVar7 < 0x40) goto LAB_00196853;
    uVar10 = uVar7 >> 6;
  }
  pp_Var8 = (_func_int **)
            ((uVar7 + uVar10 * -0x40) * 8 + *(long *)(ptVar2[3].line_num + uVar10 * 8));
LAB_00196853:
  instance_type::check_define_var
            ((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (tree_node *)*pp_Var8,true,false);
  return;
}

Assistant:

void method_for::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (tree.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (tree.root().data()->get_type() != token_types::parallel)
			throw compile_error("Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>");
		auto &parallel_list = static_cast<token_parallel *>(tree.root().data())->get_parallel();
		if (parallel_list.size() != 3)
			throw compile_error("Wrong grammar in for statement, expect <id> = <expression>, <condition>, <process>");
		context->instance->check_define_var(parallel_list[0].root(), true);
	}